

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O0

string * __thiscall Response::prepare_url(Response *this,string *url)

{
  char *src;
  string *in_RDX;
  string *in_RDI;
  unsigned_long pos;
  string *decoded_filepath;
  Response *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  string local_40 [32];
  long local_20;
  
  local_20 = std::__cxx11::string::find((char *)in_RDX,0x113733);
  if (local_20 != -1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)in_RDX);
    std::__cxx11::string::operator=(in_RDX,local_40);
    std::__cxx11::string::~string(local_40);
  }
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::length();
  std::__cxx11::string::resize((ulong)in_RDI);
  src = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::data();
  decode_url(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,src);
  return in_RDI;
}

Assistant:

std::string Response::prepare_url(std::string url) const  {
    const unsigned long pos = url.find("?");
    if (pos != std::string::npos) {
        url = url.substr(0, pos);
    }

    std::string decoded_filepath;
    decoded_filepath.resize(url.length());
    decode_url(decoded_filepath.begin(), url.data());

    return decoded_filepath;
}